

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageio.h
# Opt level: O0

ImageSpec * __thiscall
ImageInput::spec_dimensions(ImageInput *this,uint32_t param_2,uint32_t param_3)

{
  long *in_RSI;
  ImageSpec *in_RDI;
  ImageSpec *this_00;
  
  this_00 = in_RDI;
  (**(code **)(*in_RSI + 0x70))();
  ImageSpec::ImageSpec(this_00,in_RDI);
  return this_00;
}

Assistant:

virtual ImageSpec spec_dimensions (uint32_t /*subimage*/, uint32_t /*miplevel=0*/) {
        return spec();
    }